

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTinySVD.cpp
# Opt level: O0

void testTinySVD_3x3<double>(Matrix33<double> *A)

{
  double dVar1;
  bool bVar2;
  ostream *this;
  double *pdVar3;
  ostream *poVar4;
  ostream *poVar5;
  Matrix33<double> *in_RDI;
  int j;
  int i;
  Matrix33<double> B;
  int cols [3];
  int local_b0;
  int local_ac;
  Matrix33<double> local_a8;
  int local_5c [21];
  Matrix33<double> *local_8;
  
  local_8 = in_RDI;
  this = std::operator<<((ostream *)&std::cout,"Verifying SVD for [[");
  pdVar3 = Imath_3_2::Matrix33<double>::operator[](local_8,0);
  poVar4 = (ostream *)std::ostream::operator<<(this,*pdVar3);
  poVar4 = std::operator<<(poVar4,", ");
  pdVar3 = Imath_3_2::Matrix33<double>::operator[](local_8,0);
  poVar5 = (ostream *)std::ostream::operator<<(poVar4,pdVar3[1]);
  poVar5 = std::operator<<(poVar5,", ");
  pdVar3 = Imath_3_2::Matrix33<double>::operator[](local_8,0);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,pdVar3[2]);
  poVar5 = std::operator<<(poVar5,"], ");
  poVar5 = std::operator<<(poVar5,"[");
  pdVar3 = Imath_3_2::Matrix33<double>::operator[](local_8,1);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pdVar3);
  poVar5 = std::operator<<(poVar5,", ");
  pdVar3 = Imath_3_2::Matrix33<double>::operator[](local_8,1);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,pdVar3[1]);
  poVar5 = std::operator<<(poVar5,", ");
  pdVar3 = Imath_3_2::Matrix33<double>::operator[](local_8,1);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,pdVar3[2]);
  poVar5 = std::operator<<(poVar5,"], ");
  poVar5 = std::operator<<(poVar5,"[");
  pdVar3 = Imath_3_2::Matrix33<double>::operator[](local_8,2);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pdVar3);
  poVar5 = std::operator<<(poVar5,", ");
  pdVar3 = Imath_3_2::Matrix33<double>::operator[](local_8,2);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,pdVar3[1]);
  poVar5 = std::operator<<(poVar5,", ");
  pdVar3 = Imath_3_2::Matrix33<double>::operator[](local_8,2);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,pdVar3[2]);
  std::operator<<(poVar5,"]]\n");
  verifyTinySVD_3x3<double>((Matrix33<double> *)B.x[2][0]);
  Imath_3_2::Matrix33<double>::transposed((Matrix33<double> *)this);
  verifyTinySVD_3x3<double>((Matrix33<double> *)B.x[2][0]);
  local_5c[0] = 0;
  local_5c[1] = 1;
  local_5c[2] = 2;
  do {
    Imath_3_2::Matrix33<double>::Matrix33(&local_a8);
    for (local_ac = 0; local_ac < 3; local_ac = local_ac + 1) {
      for (local_b0 = 0; local_b0 < 3; local_b0 = local_b0 + 1) {
        pdVar3 = Imath_3_2::Matrix33<double>::operator[](local_8,local_ac);
        dVar1 = pdVar3[local_5c[local_b0]];
        pdVar3 = Imath_3_2::Matrix33<double>::operator[](&local_a8,local_ac);
        pdVar3[local_b0] = dVar1;
      }
    }
    verifyTinySVD_3x3<double>((Matrix33<double> *)B.x[2][0]);
    bVar2 = std::next_permutation<int*>((int *)poVar4,(int *)this);
  } while (bVar2);
  return;
}

Assistant:

void
testTinySVD_3x3 (const IMATH_INTERNAL_NAMESPACE::Matrix33<T>& A)
{
    std::cout << "Verifying SVD for [[" << A[0][0] << ", " << A[0][1] << ", "
              << A[0][2] << "], "
              << "[" << A[1][0] << ", " << A[1][1] << ", " << A[1][2] << "], "
              << "[" << A[2][0] << ", " << A[2][1] << ", " << A[2][2] << "]]\n";

    verifyTinySVD_3x3 (A);
    verifyTinySVD_3x3 (A.transposed ());

    // Try all different orderings of the columns of A:
    int cols[3] = {0, 1, 2};
    do
    {
        IMATH_INTERNAL_NAMESPACE::Matrix33<T> B;
        for (int i = 0; i < 3; ++i)
            for (int j = 0; j < 3; ++j)
                B[i][j] = A[i][cols[j]];

        verifyTinySVD_3x3 (B);
    } while (std::next_permutation (cols, cols + 3));
}